

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-hash.h
# Opt level: O2

uint64_t mir_hash_strict(void *key,size_t len,uint64_t seed)

{
  uint64_t uVar1;
  
  uVar1 = mir_hash_1(key,len,seed,0);
  return uVar1;
}

Assistant:

static inline uint64_t mir_hash_strict (const void *key, size_t len, uint64_t seed) {
  return mir_hash_1 (key, len, seed, 0);
}